

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

int __thiscall
vkt::shaderexecutor::BuiltinPrecisionTests::init(BuiltinPrecisionTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> shaderTypes;
  MovePtr<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
  completeCases;
  MovePtr<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
  computeOnlyCases;
  ShaderType local_4c;
  _Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_> local_48;
  UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
  local_28;
  UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
  local_18;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  createComputeOnlyBuiltinCases();
  createCompleteBuiltinCases();
  local_4c = SHADERTYPE_COMPUTE;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::emplace_back<glu::ShaderType>
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)&local_48,&local_4c);
  addBuiltinPrecisionTests
            ((this->super_TestCaseGroup).super_TestNode.m_testCtx,local_18.m_data.ptr,
             (vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)&local_48,
             &this->super_TestCaseGroup);
  if (local_48._M_impl.super__Vector_impl_data._M_finish !=
      local_48._M_impl.super__Vector_impl_data._M_start) {
    local_48._M_impl.super__Vector_impl_data._M_finish =
         local_48._M_impl.super__Vector_impl_data._M_start;
  }
  local_4c = SHADERTYPE_VERTEX;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::emplace_back<glu::ShaderType>
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)&local_48,&local_4c);
  local_4c = SHADERTYPE_FRAGMENT;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::emplace_back<glu::ShaderType>
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)&local_48,&local_4c);
  local_4c = SHADERTYPE_COMPUTE;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::emplace_back<glu::ShaderType>
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)&local_48,&local_4c);
  addBuiltinPrecisionTests
            ((this->super_TestCaseGroup).super_TestNode.m_testCtx,local_28.m_data.ptr,
             (vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)&local_48,
             &this->super_TestCaseGroup);
  de::details::
  UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
  ::~UniqueBase(&local_28);
  de::details::
  UniqueBase<const_vkt::shaderexecutor::CaseFactories,_de::DefaultDeleter<const_vkt::shaderexecutor::CaseFactories>_>
  ::~UniqueBase(&local_18);
  std::_Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>::~_Vector_base(&local_48);
  return extraout_EAX;
}

Assistant:

void BuiltinPrecisionTests::init (void)
{
	std::vector<glu::ShaderType>		shaderTypes;
	de::MovePtr<const CaseFactories>	computeOnlyCases	= createComputeOnlyBuiltinCases();
	de::MovePtr<const CaseFactories>	completeCases		= createCompleteBuiltinCases();

	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	addBuiltinPrecisionTests(m_testCtx,
							 *computeOnlyCases,
							 shaderTypes,
							 *this);

	shaderTypes.clear();
	shaderTypes.push_back(glu::SHADERTYPE_VERTEX);
	shaderTypes.push_back(glu::SHADERTYPE_FRAGMENT);
	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	addBuiltinPrecisionTests(m_testCtx,
							 *completeCases,
							 shaderTypes,
							 *this);
}